

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O3

void __thiscall
btHashMap<btHashPtr,_int>::insert(btHashMap<btHashPtr,_int> *this,btHashPtr *key,int *value)

{
  uint uVar1;
  int *ptr;
  btHashPtr *ptr_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  btHashPtr *pbVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  iVar4 = (key->field_0).m_hashValues[0];
  iVar8 = (key->field_0).m_hashValues[1];
  iVar10 = (this->m_valueArray).m_capacity;
  iVar2 = findIndex(this,key);
  if (iVar2 != -1) {
    (this->m_valueArray).m_data[iVar2] = *value;
    return;
  }
  uVar1 = (this->m_valueArray).m_size;
  uVar7 = (this->m_valueArray).m_capacity;
  uVar3 = uVar1;
  if (uVar1 != uVar7) goto LAB_001e3998;
  iVar2 = 1;
  if (uVar1 != 0) {
    iVar2 = uVar1 * 2;
  }
  if (iVar2 <= (int)uVar1) goto LAB_001e3998;
  if (iVar2 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)btAlignedAllocInternal((long)iVar2 << 2,0x10);
    uVar3 = (this->m_valueArray).m_size;
  }
  ptr = (this->m_valueArray).m_data;
  if ((int)uVar3 < 1) {
    if (ptr != (int *)0x0) goto LAB_001e3975;
  }
  else {
    uVar9 = 0;
    do {
      piVar5[uVar9] = ptr[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
LAB_001e3975:
    if ((this->m_valueArray).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr);
    }
    uVar3 = (this->m_valueArray).m_size;
  }
  (this->m_valueArray).m_ownsMemory = true;
  (this->m_valueArray).m_data = piVar5;
  (this->m_valueArray).m_capacity = iVar2;
LAB_001e3998:
  (this->m_valueArray).m_data[(int)uVar3] = *value;
  piVar5 = &(this->m_valueArray).m_size;
  *piVar5 = *piVar5 + 1;
  uVar3 = (this->m_keyArray).m_size;
  if (uVar3 == (this->m_keyArray).m_capacity) {
    iVar2 = 1;
    if (uVar3 != 0) {
      iVar2 = uVar3 * 2;
    }
    if ((int)uVar3 < iVar2) {
      if (iVar2 == 0) {
        pbVar6 = (btHashPtr *)0x0;
      }
      else {
        pbVar6 = (btHashPtr *)btAlignedAllocInternal((long)iVar2 << 3,0x10);
        uVar3 = (this->m_keyArray).m_size;
      }
      if (0 < (int)uVar3) {
        uVar9 = 0;
        do {
          pbVar6[uVar9].field_0 = (this->m_keyArray).m_data[uVar9].field_0;
          uVar9 = uVar9 + 1;
        } while (uVar3 != uVar9);
      }
      ptr_00 = (this->m_keyArray).m_data;
      if ((ptr_00 != (btHashPtr *)0x0) && ((this->m_keyArray).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr_00);
      }
      (this->m_keyArray).m_ownsMemory = true;
      (this->m_keyArray).m_data = pbVar6;
      (this->m_keyArray).m_capacity = iVar2;
      uVar3 = (this->m_keyArray).m_size;
    }
  }
  (this->m_keyArray).m_data[(int)uVar3].field_0 = key->field_0;
  piVar5 = &(this->m_keyArray).m_size;
  *piVar5 = *piVar5 + 1;
  if ((int)uVar7 < (this->m_valueArray).m_capacity) {
    growTables(this,key);
    iVar4 = (key->field_0).m_hashValues[1] + (key->field_0).m_hashValues[0];
    uVar7 = ~(iVar4 * 0x8000) + iVar4;
    uVar7 = ((int)uVar7 >> 10 ^ uVar7) * 9;
    uVar7 = (int)uVar7 >> 6 ^ uVar7;
    uVar7 = ~(uVar7 << 0xb) + uVar7;
    uVar7 = (int)uVar7 >> 0x10 ^ uVar7;
    iVar10 = (this->m_valueArray).m_capacity;
  }
  else {
    iVar8 = iVar8 + iVar4;
    uVar7 = ~(iVar8 * 0x8000) + iVar8;
    uVar7 = ((int)uVar7 >> 10 ^ uVar7) * 9;
    uVar7 = (int)uVar7 >> 6 ^ uVar7;
    uVar7 = ~(uVar7 << 0xb) + uVar7;
    uVar7 = (int)uVar7 >> 0x10 ^ uVar7;
  }
  uVar7 = iVar10 - 1U & uVar7;
  piVar5 = (this->m_hashTable).m_data;
  (this->m_next).m_data[(int)uVar1] = piVar5[(int)uVar7];
  piVar5[(int)uVar7] = uVar1;
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}